

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disjoint_sets.cpp
# Opt level: O0

size_t __thiscall geometrycentral::MarkedDisjointSets::find(MarkedDisjointSets *this,size_t x)

{
  reference pvVar1;
  size_t sVar2;
  MarkedDisjointSets *in_RSI;
  long in_RDI;
  MarkedDisjointSets *this_00;
  
  this_00 = in_RSI;
  pvVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 8),
                      (size_type)in_RSI);
  if (in_RSI != (MarkedDisjointSets *)*pvVar1) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 8),
               (size_type)this_00);
    sVar2 = find(this_00,(size_t)in_RSI);
    pvVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 8),
                        (size_type)this_00);
    *pvVar1 = sVar2;
  }
  pvVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 8),
                      (size_type)this_00);
  return *pvVar1;
}

Assistant:

size_t MarkedDisjointSets::find(size_t x) {
  if (x != parent[x]) parent[x] = find(parent[x]);
  return parent[x];
}